

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

vector<char,_true,_5> __thiscall
immutable::vector<char,_true,_5>::erase
          (vector<char,_true,_5> *this,size_type_conflict from,size_type_conflict to)

{
  rrb<char,_true,_5> *prVar1;
  uint in_ECX;
  undefined4 in_register_00000034;
  vector<char,_true,_5> local_30;
  vector<char,_true,_5> local_28;
  
  if (to < in_ECX) {
    take(&local_28,from);
    drop(&local_30,from);
    operator+((immutable *)this,&local_28,&local_30);
  }
  else {
    prVar1 = *(rrb<char,_true,_5> **)CONCAT44(in_register_00000034,from);
    (this->_impl).ptr = prVar1;
    if (prVar1 != (rrb<char,_true,_5> *)0x0) {
      LOCK();
      (prVar1->_ref_count).super___atomic_base<unsigned_int>._M_i =
           (prVar1->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
  }
  if (to < in_ECX) {
    ref<immutable::rrb<char,_true,_5>_>::~ref(&local_30._impl);
    ref<immutable::rrb<char,_true,_5>_>::~ref(&local_28._impl);
  }
  return (vector<char,_true,_5>)(ref<immutable::rrb<char,_true,_5>_>)this;
}

Assistant:

vector erase(size_type from, size_type to) const
        {
        return to > from ? take(from) + drop(to) : *this;
        }